

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_player_spells(void)

{
  char *message;
  int local_18;
  ushort local_12;
  wchar_t cnt;
  wchar_t wStack_c;
  uint16_t tmp16u;
  wchar_t i;
  
  rd_u16b(&local_12);
  if ((player->class->magic).total_spells < (int)(uint)local_12) {
    message = format("Too many player spells (%d).",(ulong)local_12);
    note(message);
    wStack_c = L'\xffffffff';
  }
  else {
    player_spells_init(player);
    for (cnt = L'\0'; cnt < (int)(uint)local_12; cnt = cnt + L'\x01') {
      rd_byte(player->spell_flags + cnt);
    }
    local_18 = 0;
    for (cnt = L'\0'; cnt < (int)(uint)local_12; cnt = cnt + L'\x01') {
      rd_byte(player->spell_order + local_18);
      local_18 = local_18 + 1;
    }
    wStack_c = L'\0';
  }
  return wStack_c;
}

Assistant:

int rd_player_spells(void)
{
	int i;
	uint16_t tmp16u;
	
	int cnt;
	
	/* Read the number of spells */
	rd_u16b(&tmp16u);
	if (tmp16u > player->class->magic.total_spells) {
		note(format("Too many player spells (%d).", tmp16u));
		return (-1);
	}

	/* Initialise */
	player_spells_init(player);
	
	/* Read the spell flags */
	for (i = 0; i < tmp16u; i++)
		rd_byte(&player->spell_flags[i]);
	
	/* Read the spell order */
	for (i = 0, cnt = 0; i < tmp16u; i++, cnt++)
		rd_byte(&player->spell_order[cnt]);
	
	/* Success */
	return (0);
}